

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

size_t ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl,UA_Job **jobs,UA_UInt16 timeout)

{
  size_t *psVar1;
  ServerNetworkLayerTCP *layer;
  int *piVar2;
  UA_Logger logger;
  undefined8 uVar3;
  UA_UInt32 UVar4;
  UA_UInt32 UVar5;
  UA_UInt32 UVar6;
  UA_Int32 UVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  UA_StatusCode UVar12;
  void *__ptr;
  long lVar13;
  UA_Connection *__ptr_00;
  uint *puVar14;
  char *pcVar15;
  ConnectionMapping *pCVar16;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  undefined8 *puVar20;
  long lVar21;
  ulong uVar22;
  undefined1 local_178 [8];
  fd_set errset;
  fd_set fdset;
  timeval tmptv;
  socklen_t addrlen;
  int i;
  undefined1 auStack_58 [8];
  sockaddr_in addr;
  long local_38;
  
  layer = (ServerNetworkLayerTCP *)nl->handle;
  sVar19 = layer->mappingsSize;
  __ptr = malloc(sVar19 << 6);
  if (__ptr == (void *)0x0) {
    sVar19 = 0x80030000;
  }
  else {
    if (sVar19 == 0) {
      local_38 = 0;
    }
    else {
      lVar13 = 0;
      local_38 = 0;
      uVar18 = 0;
      do {
        pCVar16 = layer->mappings;
        piVar2 = *(int **)((long)&pCVar16->connection + lVar13);
        if ((piVar2 == (int *)0x0) || (*piVar2 == 2)) {
          lVar21 = local_38 * 0x20;
          *(undefined4 *)((long)__ptr + lVar21) = 1;
          *(int **)((long)__ptr + lVar21 + 8) = piVar2;
          uVar3 = *(undefined8 *)&pCVar16[sVar19 - 1].sockfd;
          puVar20 = (undefined8 *)((long)&pCVar16->connection + lVar13);
          *puVar20 = pCVar16[sVar19 - 1].connection;
          puVar20[1] = uVar3;
          sVar19 = layer->mappingsSize - 1;
          layer->mappingsSize = sVar19;
          *(undefined4 *)((long)__ptr + lVar21 + 0x20) = 5;
          *(code **)((long)__ptr + lVar21 + 0x30) = FreeConnectionCallback;
          *(int **)((long)__ptr + lVar21 + 0x28) = piVar2;
          local_38 = local_38 + 2;
        }
        uVar18 = uVar18 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar18 < sVar19);
    }
    addr.sin_zero = (uchar  [8])jobs;
    UVar7 = setFDSet(layer,(fd_set *)(errset.fds_bits + 0xf));
    setFDSet(layer,(fd_set *)local_178);
    fdset.fds_bits[0xf] = 0;
    tmptv.tv_sec = (ulong)timeout * 1000;
    iVar8 = select(UVar7 + 1,(fd_set *)(errset.fds_bits + 0xf),(fd_set *)0x0,(fd_set *)local_178,
                   (timeval *)(fdset.fds_bits + 0xf));
    if (iVar8 < 1 && local_38 == 0) {
      free(__ptr);
      *(undefined8 *)addr.sin_zero = 0;
      sVar19 = 0;
    }
    else {
      uVar10 = layer->serversockfd;
      uVar9 = uVar10 + 0x3f;
      if (-1 < (int)uVar10) {
        uVar9 = uVar10;
      }
      if (((ulong)errset.fds_bits[(long)((int)uVar9 >> 6) + 0xf] >> ((ulong)uVar10 & 0x3f) & 1) != 0
         ) {
        iVar8 = iVar8 + -1;
        uVar10 = accept(uVar10,(sockaddr *)0x0,(socklen_t *)0x0);
        if (-1 < (int)uVar10) {
          socket_set_nonblocking(uVar10);
          tmptv.tv_usec._4_4_ = 1;
          setsockopt(uVar10,6,1,(void *)((long)&tmptv.tv_usec + 4),4);
          __ptr_00 = (UA_Connection *)malloc(0x88);
          if (__ptr_00 != (UA_Connection *)0x0) {
            tmptv.tv_usec._0_4_ = 0x10;
            iVar11 = getpeername(uVar10,(sockaddr *)auStack_58,(socklen_t *)&tmptv.tv_usec);
            logger = layer->logger;
            if (iVar11 == 0) {
              pcVar15 = inet_ntoa((in_addr)auStack_58._4_4_);
              UA_LOG_INFO(logger,UA_LOGCATEGORY_NETWORK,
                          "Connection %i | New connection over TCP from %s:%d",(ulong)uVar10,pcVar15
                          ,(ulong)(ushort)(auStack_58._2_2_ << 8 | (ushort)auStack_58._2_2_ >> 8));
            }
            else {
              puVar14 = (uint *)__errno_location();
              UA_LOG_WARNING(logger,UA_LOGCATEGORY_NETWORK,
                             "Connection %i | New connection over TCP, getpeername failed with errno %i"
                             ,(ulong)uVar10,(ulong)*puVar14);
            }
            *(undefined8 *)&__ptr_00->sockfd = 0;
            __ptr_00->handle = (void *)0x0;
            __ptr_00->send = (_func_UA_StatusCode_UA_Connection_ptr_UA_ByteString_ptr *)0x0;
            __ptr_00->recv =
                 (_func_UA_StatusCode_UA_Connection_ptr_UA_ByteString_ptr_UA_UInt32 *)0x0;
            __ptr_00->getSendBuffer =
                 (_func_UA_StatusCode_UA_Connection_ptr_size_t_UA_ByteString_ptr *)0x0;
            __ptr_00->releaseSendBuffer = (_func_void_UA_Connection_ptr_UA_ByteString_ptr *)0x0;
            (__ptr_00->incompleteMessage).length = 0;
            (__ptr_00->incompleteMessage).data = (UA_Byte *)0x0;
            *(undefined8 *)&(__ptr_00->remoteConf).maxChunkCount = 0;
            __ptr_00->channel = (UA_SecureChannel *)0x0;
            __ptr_00->sockfd = uVar10;
            __ptr_00->handle = layer;
            UVar4 = (layer->conf).sendBufferSize;
            UVar5 = (layer->conf).recvBufferSize;
            UVar6 = (layer->conf).maxMessageSize;
            (__ptr_00->localConf).protocolVersion = (layer->conf).protocolVersion;
            (__ptr_00->localConf).sendBufferSize = UVar4;
            (__ptr_00->localConf).recvBufferSize = UVar5;
            (__ptr_00->localConf).maxMessageSize = UVar6;
            (__ptr_00->localConf).maxChunkCount = (layer->conf).maxChunkCount;
            UVar4 = (layer->conf).sendBufferSize;
            UVar5 = (layer->conf).recvBufferSize;
            UVar6 = (layer->conf).maxMessageSize;
            (__ptr_00->remoteConf).protocolVersion = (layer->conf).protocolVersion;
            (__ptr_00->remoteConf).sendBufferSize = UVar4;
            (__ptr_00->remoteConf).recvBufferSize = UVar5;
            (__ptr_00->remoteConf).maxMessageSize = UVar6;
            (__ptr_00->remoteConf).maxChunkCount = (layer->conf).maxChunkCount;
            __ptr_00->send = socket_write;
            __ptr_00->close = ServerNetworkLayerTCP_closeConnection;
            __ptr_00->getSendBuffer = ServerNetworkLayerGetSendBuffer;
            __ptr_00->releaseSendBuffer = ServerNetworkLayerReleaseSendBuffer;
            __ptr_00->releaseRecvBuffer = ServerNetworkLayerReleaseRecvBuffer;
            __ptr_00->state = UA_CONNECTION_OPENING;
            pCVar16 = (ConnectionMapping *)
                      realloc(layer->mappings,layer->mappingsSize * 0x10 + 0x10);
            if (pCVar16 == (ConnectionMapping *)0x0) {
              UA_LOG_ERROR(layer->logger,UA_LOGCATEGORY_NETWORK,"No memory for a new Connection");
              free(__ptr_00);
            }
            else {
              layer->mappings = pCVar16;
              sVar19 = layer->mappingsSize;
              pCVar16[sVar19].connection = __ptr_00;
              pCVar16[sVar19].sockfd = uVar10;
              layer->mappingsSize = sVar19 + 1;
            }
          }
        }
      }
      auStack_58 = (undefined1  [8])0x0;
      addr.sin_family = 0;
      addr.sin_port = 0;
      addr.sin_addr.s_addr = 0;
      uVar18 = 0;
      if ((layer->mappingsSize != 0) && (iVar8 != 0)) {
        uVar22 = 1;
        lVar13 = 0;
        uVar18 = 0;
        do {
          uVar10 = *(uint *)((long)&layer->mappings->sockfd + lVar13);
          uVar9 = uVar10 + 0x3f;
          if (-1 < (int)uVar10) {
            uVar9 = uVar10;
          }
          if ((((ulong)errset.fds_bits[(long)((int)uVar9 >> 6) + -1] >> ((ulong)uVar10 & 0x3f) & 1)
               != 0) ||
             ((errset.fds_bits[(long)((int)uVar9 >> 6) + 0xf] & 1L << ((byte)uVar10 & 0x3f)) != 0))
          {
            UVar12 = socket_recv(*(UA_Connection **)((long)&layer->mappings->connection + lVar13),
                                 (UA_ByteString *)auStack_58,0);
            if (UVar12 == 0x80ae0000) {
              lVar21 = *(long *)((long)&layer->mappings->connection + lVar13);
              UA_LOG_INFO(layer->logger,UA_LOGCATEGORY_NETWORK,
                          "Connection %i | Connection closed from remote",
                          (ulong)*(uint *)(lVar21 + 0x38));
              lVar17 = uVar18 * 0x20;
              *(undefined4 *)((long)__ptr + lVar17 + local_38 * 0x20) = 1;
              *(long *)((long)__ptr + lVar17 + 8 + local_38 * 0x20) = lVar21;
              pCVar16 = layer->mappings + (layer->mappingsSize - 1);
              uVar3 = *(undefined8 *)&pCVar16->sockfd;
              puVar20 = (undefined8 *)((long)&layer->mappings->connection + lVar13);
              *puVar20 = pCVar16->connection;
              puVar20[1] = uVar3;
              layer->mappingsSize = layer->mappingsSize - 1;
              local_38 = local_38 + 1;
              *(undefined4 *)((long)__ptr + lVar17 + local_38 * 0x20) = 5;
              *(code **)((long)__ptr + lVar17 + 0x10 + local_38 * 0x20) = FreeConnectionCallback;
              *(long *)((long)__ptr + lVar17 + 8 + local_38 * 0x20) = lVar21;
            }
            else {
              if (UVar12 != 0) goto LAB_001291be;
              lVar21 = uVar18 * 0x20;
              *(undefined8 *)((long)__ptr + lVar21 + 8 + local_38 * 0x20) =
                   *(undefined8 *)((long)&layer->mappings->connection + lVar13);
              psVar1 = (size_t *)((long)__ptr + lVar21 + 0x10 + local_38 * 0x20);
              *psVar1 = (size_t)auStack_58;
              psVar1[1] = addr._0_8_;
              *(undefined4 *)((long)__ptr + lVar21 + local_38 * 0x20) = 2;
            }
            uVar18 = uVar18 + 1;
          }
LAB_001291be:
          if (layer->mappingsSize <= uVar22) break;
          uVar22 = uVar22 + 1;
          lVar13 = lVar13 + 0x10;
        } while (uVar18 < (ulong)(long)iVar8);
      }
      sVar19 = local_38 + uVar18;
      if (sVar19 == 0) {
        free(__ptr);
        __ptr = (void *)0x0;
      }
      *(void **)addr.sin_zero = __ptr;
    }
  }
  return sVar19;
}

Assistant:

static size_t
ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl, UA_Job **jobs,
                              UA_UInt16 timeout) {
    /* Every open socket can generate two jobs */
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_Job *js = malloc(sizeof(UA_Job) * (size_t)((layer->mappingsSize * 2)));
    if(!js)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Remove closed sockets */
    size_t totalJobs = removeClosedConnections(layer, js);

    /* Listen on open sockets (including the server) */
    fd_set fdset, errset;
    UA_Int32 highestfd = setFDSet(layer, &fdset);
    setFDSet(layer, &errset);
    struct timeval tmptv = {0, timeout * 1000};
    UA_Int32 resultsize = select(highestfd+1, &fdset, NULL, &errset, &tmptv);
    if(totalJobs == 0 && resultsize <= 0) {
        free(js);
        *jobs = NULL;
        return 0;
    }

    /* Accept new connection via the server socket (can only be a single one) */
    if(UA_fd_isset(layer->serversockfd, &fdset)) {
        --resultsize;
        SOCKET newsockfd = accept((SOCKET)layer->serversockfd, NULL, NULL);
#ifdef _WIN32
        if(newsockfd != INVALID_SOCKET)
#else
        if(newsockfd >= 0)
#endif
        {
            socket_set_nonblocking(newsockfd);
            /* Do not merge packets on the socket (disable Nagle's algorithm) */
            int i = 1;
            setsockopt(newsockfd, IPPROTO_TCP, TCP_NODELAY, (void *)&i, sizeof(i));
            ServerNetworkLayerTCP_add(layer, (UA_Int32)newsockfd);
        }
    }

    /* Read from established sockets */
    UA_ByteString buf = UA_BYTESTRING_NULL;
    size_t j = 0;
    for(size_t i = 0; i < layer->mappingsSize && j < (size_t)resultsize; ++i) {
        if(!UA_fd_isset(layer->mappings[i].sockfd, &errset) &&
           !UA_fd_isset(layer->mappings[i].sockfd, &fdset))
          continue;

        UA_StatusCode retval = socket_recv(layer->mappings[i].connection, &buf, 0);
        if(retval == UA_STATUSCODE_GOOD) {
            js[totalJobs + j].job.binaryMessage.connection = layer->mappings[i].connection;
            js[totalJobs + j].job.binaryMessage.message = buf;
            js[totalJobs + j].type = UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER;
            ++j;
        } else if (retval == UA_STATUSCODE_BADCONNECTIONCLOSED) {
            UA_Connection *c = layer->mappings[i].connection;
            UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                        "Connection %i | Connection closed from remote", c->sockfd);
            /* the socket was closed from remote */
            js[totalJobs + j].type = UA_JOBTYPE_DETACHCONNECTION;
            js[totalJobs + j].job.closeConnection = c;
            layer->mappings[i] = layer->mappings[layer->mappingsSize-1];
            --layer->mappingsSize;
            ++totalJobs; /* increase j only once */
            js[totalJobs + j].type = UA_JOBTYPE_METHODCALL_DELAYED;
            js[totalJobs + j].job.methodCall.method = FreeConnectionCallback;
            js[totalJobs + j].job.methodCall.data = c;
            ++j;
        }
    }
    totalJobs += j;

    if(totalJobs == 0) {
        free(js);
        js = NULL;
    }
    *jobs = js;
    return totalJobs;
}